

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O1

void duckdb::ArrowBit::PopulateSchema
               (DuckDBArrowSchemaHolder *root_holder,ArrowSchema *schema,LogicalType *type,
               ClientContext *context,ArrowTypeExtension *extension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  reference pvVar2;
  char *pcVar3;
  ClientProperties options;
  ArrowSchemaMetadata schema_metadata;
  string local_1b0;
  string local_190;
  ArrowExtensionMetadata local_170;
  ArrowSchemaMetadata local_f0;
  ArrowExtensionMetadata local_b0;
  
  ArrowExtensionMetadata::ArrowExtensionMetadata(&local_170,&extension->extension_metadata);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_170.type_name._M_dataplus._M_p,
             local_170.type_name._M_dataplus._M_p + local_170.type_name._M_string_length);
  ArrowExtensionMetadata::ArrowExtensionMetadata(&local_b0,&extension->extension_metadata);
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_b0.vendor_name._M_dataplus._M_p,
             local_b0.vendor_name._M_dataplus._M_p + local_b0.vendor_name._M_string_length);
  ArrowSchemaMetadata::NonCanonicalType(&local_f0,&local_190,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.arrow_format._M_dataplus._M_p != &local_b0.arrow_format.field_2) {
    operator_delete(local_b0.arrow_format._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.type_name._M_dataplus._M_p != &local_b0.type_name.field_2) {
    operator_delete(local_b0.type_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.vendor_name._M_dataplus._M_p != &local_b0.vendor_name.field_2) {
    operator_delete(local_b0.vendor_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.extension_name._M_dataplus._M_p != &local_b0.extension_name.field_2) {
    operator_delete(local_b0.extension_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.arrow_format._M_dataplus._M_p != &local_170.arrow_format.field_2) {
    operator_delete(local_170.arrow_format._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.type_name._M_dataplus._M_p != &local_170.type_name.field_2) {
    operator_delete(local_170.type_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_170.vendor_name._M_dataplus._M_p._1_7_,
                  (char)local_170.vendor_name._M_dataplus._M_p) != &local_170.vendor_name.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_170.vendor_name._M_dataplus._M_p._1_7_,
                             (char)local_170.vendor_name._M_dataplus._M_p));
  }
  paVar1 = &local_170.extension_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.extension_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_170.extension_name._M_dataplus._M_p);
  }
  ArrowSchemaMetadata::SerializeMetadata((ArrowSchemaMetadata *)&local_170);
  ::std::
  vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
  ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
            ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
              *)&root_holder->metadata_info,
             (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_170);
  if (local_170.extension_name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete__(local_170.extension_name._M_dataplus._M_p);
  }
  pvVar2 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                     (&root_holder->metadata_info);
  schema->metadata =
       (pvVar2->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  ClientContext::GetClientProperties((ClientProperties *)&local_170,context);
  pcVar3 = "z";
  if ((char)local_170.vendor_name._M_dataplus._M_p == '\x01') {
    pcVar3 = "Z";
  }
  schema->format = pcVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.extension_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_170.extension_name._M_dataplus._M_p);
  }
  ::std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::~unique_ptr
            (&local_f0.extension_metadata_map.
              super_unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_f0);
  return;
}

Assistant:

static void PopulateSchema(DuckDBArrowSchemaHolder &root_holder, ArrowSchema &schema, const LogicalType &type,
	                           ClientContext &context, const ArrowTypeExtension &extension) {
		const ArrowSchemaMetadata schema_metadata = ArrowSchemaMetadata::NonCanonicalType(
		    extension.GetInfo().GetTypeName(), extension.GetInfo().GetVendorName());
		root_holder.metadata_info.emplace_back(schema_metadata.SerializeMetadata());
		schema.metadata = root_holder.metadata_info.back().get();
		const auto options = context.GetClientProperties();
		if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
			schema.format = "Z";
		} else {
			schema.format = "z";
		}
	}